

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O1

void __thiscall
duckdb::CheckpointReader::ReadTableData
          (CheckpointReader *this,CatalogTransaction transaction,Deserializer *deserializer,
          BoundCreateTableInfo *bound_info)

{
  BoundCreateTableInfo *info;
  int iVar1;
  undefined4 extraout_var;
  reference pvVar2;
  long lVar3;
  pointer pPVar4;
  size_type __n;
  MetaBlockPointer MVar5;
  vector<duckdb::BlockPointer,_true> index_pointers;
  TableDataReader data_reader;
  MetadataReader table_data_reader;
  vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_> local_168;
  vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_> local_148;
  BoundCreateTableInfo *local_130;
  vector<duckdb::BlockPointer,_true> local_128;
  idx_t local_110;
  undefined8 local_108;
  idx_t local_100;
  vector<duckdb::BlockPointer,_true> local_f8;
  TableDataReader local_e0;
  undefined1 local_d0 [96];
  vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_> local_70;
  vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  vStack_58;
  block_id_t local_40;
  undefined8 uStack_38;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"table_pointer");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  MVar5 = MetaBlockPointer::Deserialize(deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x66,"total_rows");
  iVar1 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
  local_110 = CONCAT44(extraout_var,iVar1);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  local_f8.super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
  super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
  super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
  super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Deserializer::ReadPropertyWithExplicitDefault<duckdb::vector<duckdb::BlockPointer,true>>
            (&local_128,deserializer,0x67,"index_pointers",&local_f8);
  if (local_f8.super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
      super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
                    super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_148.super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x68,"index_storage_infos");
  if ((char)iVar1 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_168.
    super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.
         super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_168.
    super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.
         super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_168.
    super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.
         super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_148.
    super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.
    super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.
    super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    Deserializer::Read<duckdb::vector<duckdb::IndexStorageInfo,true>>
              ((type *)&local_168,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  local_108 = MVar5._8_8_;
  local_100 = MVar5.block_pointer;
  ::std::vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>::~vector
            (&local_148);
  local_130 = bound_info;
  if (local_168.
      super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_168.
      super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    if (local_128.super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
        super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_128.super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
        super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
        super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        local_d0._8_8_ = (MetadataManager *)0x0;
        local_d0[0x10] = '\0';
        local_d0._40_8_ = local_d0 + 0x58;
        local_d0._48_8_ = &DAT_00000001;
        local_d0._56_8_ = (_Hash_node_base *)0x0;
        local_d0._64_8_ = 0;
        local_d0._72_4_ = 1.0;
        vStack_58.
        super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_58.
        super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_70.
        super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_58.
        super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_70.
        super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_70.
        super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d0._80_8_ = 0;
        local_d0._88_8_ = (__node_base_ptr)0x0;
        local_40 = -1;
        uStack_38._0_4_ = 0;
        uStack_38._4_4_ = 0;
        local_d0._0_8_ = local_d0 + 0x10;
        pvVar2 = vector<duckdb::BlockPointer,_true>::operator[](&local_128,__n);
        local_40 = pvVar2->block_id;
        uStack_38._0_4_ = pvVar2->offset;
        uStack_38._4_4_ = pvVar2->unused_padding;
        ::std::vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>::
        push_back(&(bound_info->indexes).
                   super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>
                  ,(value_type *)local_d0);
        ::std::
        vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
        ::~vector(&vStack_58);
        ::std::
        vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>::
        ~vector(&local_70);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)(local_d0 + 0x28));
        if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
          operator_delete((void *)local_d0._0_8_);
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)local_128.
                                   super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>
                                   .
                                   super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_128.
                                   super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>
                                   .
                                   super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
  }
  else {
    ::std::vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>::operator=
              (&(bound_info->indexes).
                super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>,
               &local_168);
  }
  lVar3 = __dynamic_cast(deserializer,&Deserializer::typeinfo,&BinaryDeserializer::typeinfo,0);
  if (lVar3 != 0) {
    lVar3 = __dynamic_cast(*(undefined8 *)(lVar3 + 0x278),&ReadStream::typeinfo,
                           &MetadataReader::typeinfo,0);
    info = local_130;
    if (lVar3 != 0) {
      MVar5.offset = (undefined4)local_108;
      MVar5.unused_padding = local_108._4_4_;
      MVar5.block_pointer = local_100;
      MetadataReader::MetadataReader
                ((MetadataReader *)local_d0,*(MetadataManager **)(lVar3 + 8),MVar5,
                 (optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>)0x0,
                 EXISTING_BLOCKS);
      TableDataReader::TableDataReader(&local_e0,(MetadataReader *)local_d0,info);
      TableDataReader::ReadTableData(&local_e0);
      pPVar4 = unique_ptr<duckdb::PersistentTableData,_std::default_delete<duckdb::PersistentTableData>,_true>
               ::operator->(&info->data);
      pPVar4->total_rows = local_110;
      MetadataReader::~MetadataReader((MetadataReader *)local_d0);
      ::std::vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>::~vector
                (&local_168);
      if (local_128.super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
          super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.
                        super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>.
                        super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    __cxa_bad_cast();
  }
  __cxa_bad_cast();
}

Assistant:

void CheckpointReader::ReadTableData(CatalogTransaction transaction, Deserializer &deserializer,
                                     BoundCreateTableInfo &bound_info) {

	// written in "SingleFileTableDataWriter::FinalizeTable"
	auto table_pointer = deserializer.ReadProperty<MetaBlockPointer>(101, "table_pointer");
	auto total_rows = deserializer.ReadProperty<idx_t>(102, "total_rows");

	// Cover reading old storage files.
	auto index_pointers = deserializer.ReadPropertyWithExplicitDefault<vector<BlockPointer>>(103, "index_pointers", {});
	// Cover reading new storage files.
	auto index_storage_infos =
	    deserializer.ReadPropertyWithExplicitDefault<vector<IndexStorageInfo>>(104, "index_storage_infos", {});

	if (!index_storage_infos.empty()) {
		bound_info.indexes = index_storage_infos;

	} else {
		// This is an old duckdb file containing index pointers and deprecated storage.
		for (idx_t i = 0; i < index_pointers.size(); i++) {
			// Deprecated storage is always true for old duckdb files.
			IndexStorageInfo index_storage_info;
			index_storage_info.root_block_ptr = index_pointers[i];
			bound_info.indexes.push_back(index_storage_info);
		}
	}

	// FIXME: icky downcast to get the underlying MetadataReader
	auto &binary_deserializer = dynamic_cast<BinaryDeserializer &>(deserializer);
	auto &reader = dynamic_cast<MetadataReader &>(binary_deserializer.GetStream());

	MetadataReader table_data_reader(reader.GetMetadataManager(), table_pointer);
	TableDataReader data_reader(table_data_reader, bound_info);
	data_reader.ReadTableData();

	bound_info.data->total_rows = total_rows;
}